

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

UInt32 crnlib::ReadMatchDistances(CLzmaEnc *p,UInt32 *numDistancePairsRes)

{
  uint uVar1;
  uint uVar2;
  UInt32 UVar3;
  Byte *pBVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  UVar3 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
  p->numAvail = UVar3;
  UVar3 = (*(p->matchFinder).GetMatches)(p->matchFinderObj,p->matches);
  if (UVar3 == 0) {
    uVar7 = 0;
  }
  else {
    uVar1 = p->matches[UVar3 - 2];
    uVar6 = (ulong)uVar1;
    uVar7 = uVar6;
    if (uVar1 == p->numFastBytes) {
      pBVar4 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
      uVar2 = 0x111;
      if (p->numAvail < 0x111) {
        uVar2 = p->numAvail;
      }
      uVar5 = (ulong)uVar2;
      if (uVar2 < uVar1) {
        uVar5 = uVar6;
      }
      for (; (uVar7 = uVar5, uVar6 < uVar2 &&
             (uVar7 = uVar6,
             pBVar4[uVar6 - 1] == pBVar4[uVar6 + (-1 - (ulong)(p->matches[UVar3 - 1] + 1))]));
          uVar6 = uVar6 + 1) {
      }
    }
  }
  p->additionalOffset = p->additionalOffset + 1;
  *numDistancePairsRes = UVar3;
  return (UInt32)uVar7;
}

Assistant:

static UInt32 ReadMatchDistances(CLzmaEnc* p, UInt32* numDistancePairsRes) {
  UInt32 lenRes = 0, numPairs;
  p->numAvail = p->matchFinder.GetNumAvailableBytes(p->matchFinderObj);
  numPairs = p->matchFinder.GetMatches(p->matchFinderObj, p->matches);
#ifdef SHOW_STAT
  printf("\n i = %d numPairs = %d    ", ttt, numPairs / 2);
  ttt++;
  {
    UInt32 i;
    for (i = 0; i < numPairs; i += 2)
      printf("%2d %6d   | ", p->matches[i], p->matches[i + 1]);
  }
#endif
  if (numPairs > 0) {
    lenRes = p->matches[numPairs - 2];
    if (lenRes == p->numFastBytes) {
      const Byte* pby = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - 1;
      UInt32 distance = p->matches[numPairs - 1] + 1;
      UInt32 numAvail = p->numAvail;
      if (numAvail > LZMA_MATCH_LEN_MAX)
        numAvail = LZMA_MATCH_LEN_MAX;
      {
        const Byte* pby2 = pby - distance;
        for (; lenRes < numAvail && pby[lenRes] == pby2[lenRes]; lenRes++)
          ;
      }
    }
  }
  p->additionalOffset++;
  *numDistancePairsRes = numPairs;
  return lenRes;
}